

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError ContinuePoll(PaAlsaStream *stream,StreamDirection streamDir,int *pollTimeout,
                    int *continuePoll)

{
  int iVar1;
  int iVar2;
  pthread_t __thread1;
  PaHostApiTypeId hostApiType;
  ulong uVar3;
  undefined4 *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int __pa_unsure_error_id;
  PaAlsaStreamComponent *otherComponent;
  PaAlsaStreamComponent *component;
  int err;
  snd_pcm_sframes_t margin;
  snd_pcm_sframes_t delay;
  PaError result;
  unsigned_long in_stack_ffffffffffffff98;
  PaAlsaStream *in_stack_ffffffffffffffa0;
  long local_50;
  long local_30;
  PaError local_24;
  undefined4 *local_20;
  int *local_18;
  int local_c;
  
  local_24 = 0;
  *in_RCX = 1;
  if (in_ESI == 0) {
    local_50 = in_RDI + 0x308;
  }
  else {
    local_50 = in_RDI + 0x288;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  iVar1 = (*alsa_snd_pcm_delay)(*(snd_pcm_t **)(local_50 + 0x38),&local_30);
  if (iVar1 < 0) {
    if (iVar1 == -0x20) {
      *local_20 = 0;
      return local_24;
    }
    if (iVar1 < 0) {
      __thread1 = pthread_self();
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar2 != 0) {
        hostApiType = iVar1 >> 0x1f;
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(hostApiType,in_stack_ffffffffffffff98,(char *)0x11dfe3);
      }
      PaUtil_DebugPrint(
                       "Expression \'err\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3350\n"
                       );
      return -9999;
    }
  }
  if (local_c == 1) {
    local_30 = *(long *)(local_50 + 0x48) - local_30;
  }
  uVar3 = local_30 - (*(ulong *)(local_50 + 0x40) >> 1);
  if ((long)uVar3 < 0) {
    *local_20 = 0;
  }
  else if (uVar3 < *(ulong *)(local_50 + 0x40)) {
    iVar1 = CalculatePollTimeout(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *local_18 = iVar1;
  }
  return local_24;
}

Assistant:

static PaError ContinuePoll( const PaAlsaStream *stream, StreamDirection streamDir, int *pollTimeout, int *continuePoll )
{
    PaError result = paNoError;
    snd_pcm_sframes_t delay, margin;
    int err;
    const PaAlsaStreamComponent *component = NULL, *otherComponent = NULL;

    *continuePoll = 1;

    if( StreamDirection_In == streamDir )
    {
        component = &stream->capture;
        otherComponent = &stream->playback;
    }
    else
    {
        component = &stream->playback;
        otherComponent = &stream->capture;
    }

    /* ALSA docs say that negative delay should indicate xrun, but in my experience alsa_snd_pcm_delay returns -EPIPE */
    if( ( err = alsa_snd_pcm_delay( otherComponent->pcm, &delay ) ) < 0 )
    {
        if( err == -EPIPE )
        {
            /* Xrun */
            *continuePoll = 0;
            goto error;
        }

        ENSURE_( err, paUnanticipatedHostError );
    }

    if( StreamDirection_Out == streamDir )
    {
        /* Number of eligible frames before capture overrun */
        delay = otherComponent->alsaBufferSize - delay;
    }
    margin = delay - otherComponent->framesPerPeriod / 2;

    if( margin < 0 )
    {
        PA_DEBUG(( "%s: Stopping poll for %s\n", __FUNCTION__, StreamDirection_In == streamDir ? "capture" : "playback" ));
        *continuePoll = 0;
    }
    else if( margin < otherComponent->framesPerPeriod )
    {
        *pollTimeout = CalculatePollTimeout( stream, margin );
        PA_DEBUG(( "%s: Trying to poll again for %s frames, pollTimeout: %d\n",
                    __FUNCTION__, StreamDirection_In == streamDir ? "capture" : "playback", *pollTimeout ));
    }

error:
    return result;
}